

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void expand_2s_i32(TCGContext_conflict9 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
                  TCGv_i32 c,_Bool scalar_first,
                  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict9 *fni)

{
  TCGv_i32 ret;
  TCGv_i32 arg1;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  uint uVar3;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  arg1 = tcg_temp_new_i32(tcg_ctx);
  for (uVar3 = 0; uVar3 < oprsz; uVar3 = uVar3 + 4) {
    tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(aofs + uVar3));
    pTVar1 = c;
    pTVar2 = ret;
    if (scalar_first) {
      pTVar1 = ret;
      pTVar2 = c;
    }
    (*fni)(tcg_ctx,arg1,pTVar2,pTVar1);
    tcg_gen_st_i32(tcg_ctx,arg1,tcg_ctx->cpu_env,(ulong)(dofs + uVar3));
  }
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
  return;
}

Assistant:

static void expand_2s_i32(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t oprsz,
                          TCGv_i32 c, bool scalar_first,
                          void (*fni)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32))
{
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    uint32_t i;

    for (i = 0; i < oprsz; i += 4) {
        tcg_gen_ld_i32(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        if (scalar_first) {
            fni(tcg_ctx, t1, c, t0);
        } else {
            fni(tcg_ctx, t1, t0, c);
        }
        tcg_gen_st_i32(tcg_ctx, t1, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
}